

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void * writer_thread(void *args)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = 5;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    load_persons((storage_t *)args);
  }
  return (void *)0x0;
}

Assistant:

void *writer_thread(void *args) {

    storage_t *st = (storage_t *)args;
    for (int i = 0; i < 5; ++i) {
        load_persons(st);
        if (i == 5) {
            delete_persons(st);
        }
    }
    return NULL;
}